

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

void __thiscall re2::NFA::NFA(NFA *this,Prog *prog)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  AddState *pAVar7;
  AddState *local_90;
  Prog *prog_local;
  NFA *this_local;
  
  SparseArray<re2::NFA::Thread_*>::SparseArray(&this->q0_);
  SparseArray<re2::NFA::Thread_*>::SparseArray(&this->q1_);
  this->prog_ = prog;
  iVar2 = Prog::start(this->prog_);
  this->start_ = iVar2;
  this->ncapture_ = 0;
  this->longest_ = false;
  this->endmatch_ = false;
  this->btext_ = (char *)0x0;
  this->etext_ = (char *)0x0;
  iVar2 = Prog::size(this->prog_);
  SparseArray<re2::NFA::Thread_*>::resize(&this->q0_,iVar2);
  iVar2 = Prog::size(this->prog_);
  SparseArray<re2::NFA::Thread_*>::resize(&this->q1_,iVar2);
  iVar2 = Prog::inst_count(this->prog_,kInstCapture);
  iVar3 = Prog::inst_count(this->prog_,kInstEmptyWidth);
  iVar4 = Prog::inst_count(this->prog_,kInstNop);
  this->nastack_ = iVar2 * 2 + iVar3 + 1 + iVar4;
  uVar5 = (ulong)this->nastack_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pAVar7 = (AddState *)operator_new__(uVar6);
  if (uVar5 != 0) {
    local_90 = pAVar7;
    do {
      AddState::AddState(local_90);
      local_90 = local_90 + 1;
    } while (local_90 != pAVar7 + uVar5);
  }
  this->astack_ = pAVar7;
  this->match_ = (char **)0x0;
  this->matched_ = false;
  this->free_threads_ = (Thread *)0x0;
  return;
}

Assistant:

NFA::NFA(Prog* prog) {
  prog_ = prog;
  start_ = prog_->start();
  ncapture_ = 0;
  longest_ = false;
  endmatch_ = false;
  btext_ = NULL;
  etext_ = NULL;
  q0_.resize(prog_->size());
  q1_.resize(prog_->size());
  // See NFA::AddToThreadq() for why this is so.
  nastack_ = 2*prog_->inst_count(kInstCapture) +
             prog_->inst_count(kInstEmptyWidth) +
             prog_->inst_count(kInstNop) + 1;  // + 1 for start inst
  astack_ = new AddState[nastack_];
  match_ = NULL;
  matched_ = false;
  free_threads_ = NULL;
}